

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

void __thiscall
Js::SimpleTypeHandler<2UL>::SimpleTypeHandler
          (SimpleTypeHandler<2UL> *this,long SharedFunctionPropertyDescriptors,byte param_3,
          uint16 param_4,uint16 param_5)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  long lVar4;
  
  DynamicTypeHandler::DynamicTypeHandler(&this->super_DynamicTypeHandler,2,param_4,param_5,'\x1d');
  (this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_013ddc20
  ;
  this->propertyCount = 2;
  this->descriptors[0].Id.ptr = (PropertyRecord *)0x0;
  this->descriptors[0].field_1.preventFalseReference = (Type)0x0;
  this->descriptors[0].field_1.Attributes = '\a';
  this->descriptors[1].Id.ptr = (PropertyRecord *)0x0;
  this->descriptors[1].field_1.preventFalseReference = (Type)0x0;
  this->descriptors[1].field_1.Attributes = '\a';
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  for (lVar4 = 8; lVar4 != 0x28; lVar4 = lVar4 + 0x10) {
    if ((*(byte *)(SharedFunctionPropertyDescriptors + lVar4) & 8) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                  ,0x42,
                                  "((SharedFunctionPropertyDescriptors[i].Attributes & 0x08) == 0)",
                                  "(SharedFunctionPropertyDescriptors[i].Attributes & PropertyDeleted) == 0"
                                 );
      if (!bVar2) goto LAB_00cc4f66;
      *puVar3 = 0;
    }
    *(undefined8 *)((long)this->descriptors + lVar4 + -8) =
         *(undefined8 *)(SharedFunctionPropertyDescriptors + -8 + lVar4);
    *(undefined1 *)((long)&this->descriptors[0].Id.ptr + lVar4) =
         *(undefined1 *)(SharedFunctionPropertyDescriptors + lVar4);
  }
  if ((param_3 & 0x60) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleTypeHandler.cpp"
                                ,0x47,
                                "((propertyTypes & ((0x80|0x10|0x20|0x40) & ~(0x10 | 0x80))) == 0)",
                                "(propertyTypes & (PropertyTypesAll & ~(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties))) == 0"
                               );
    if (!bVar2) {
LAB_00cc4f66:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  DynamicTypeHandler::SetPropertyTypes(&this->super_DynamicTypeHandler,0x90,param_3);
  DynamicTypeHandler::SetIsInlineSlotCapacityLocked(&this->super_DynamicTypeHandler);
  return;
}

Assistant:

SimpleTypeHandler<size>::SimpleTypeHandler(NO_WRITE_BARRIER_TAG_TYPE(SimplePropertyDescriptor const (&SharedFunctionPropertyDescriptors)[size]), PropertyTypes propertyTypes, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots) :
         DynamicTypeHandler(sizeof(descriptors) / sizeof(SimplePropertyDescriptor),
         inlineSlotCapacity, offsetOfInlineSlots, DefaultFlags | IsLockedFlag | MayBecomeSharedFlag | IsSharedFlag), propertyCount(size)
    {
        for (size_t i = 0; i < size; i++)
        {
            Assert((SharedFunctionPropertyDescriptors[i].Attributes & PropertyDeleted) == 0);
             // Used to init from global static BuiltInPropertyId
            NoWriteBarrierSet(descriptors[i].Id, SharedFunctionPropertyDescriptors[i].Id);
            descriptors[i].Attributes = SharedFunctionPropertyDescriptors[i].Attributes;
        }
        Assert((propertyTypes & (PropertyTypesAll & ~(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties))) == 0);
        SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesHasSpecialProperties, propertyTypes);
        SetIsInlineSlotCapacityLocked();
    }